

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cc
# Opt level: O0

void __thiscall draco::Decoder::SetSkipAttributeTransform(Decoder *this,Type att_type)

{
  undefined4 in_ESI;
  undefined8 in_RDI;
  string *name;
  AttributeKey *in_stack_ffffffffffffffb8;
  DracoOptions<draco::GeometryAttribute::Type> *in_stack_ffffffffffffffc0;
  allocator<char> local_31;
  string local_30 [16];
  undefined8 in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  
  name = (string *)&local_31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8,
             (allocator<char> *)in_stack_ffffffffffffffe0);
  DracoOptions<draco::GeometryAttribute::Type>::SetAttributeBool
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,name,SUB81((ulong)in_RDI >> 0x38,0)
            );
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

void Decoder::SetSkipAttributeTransform(GeometryAttribute::Type att_type) {
  options_.SetAttributeBool(att_type, "skip_attribute_transform", true);
}